

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.cpp
# Opt level: O0

void R_InitSkins(void)

{
  byte bVar1;
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  FTextureID lump_00;
  PClassActor *pPVar9;
  FPlayerClass *pFVar10;
  AActor *pAVar11;
  char *pcVar12;
  FPlayerSkin *pFVar13;
  double dVar14;
  spriteframewithrotate *local_d00;
  FSoundID *local_bc0;
  int sprno;
  bool res;
  FTextureID picnum;
  DWORD lnameint;
  char local_b90;
  char local_b8f;
  char local_b8e;
  char lname [9];
  int maxframe;
  spriteframewithrotate sprtemp [29];
  int local_270;
  int spr;
  int basens;
  char name [9];
  PClassPlayerPawn *type;
  int local_248;
  int sndref;
  int l;
  int lump;
  int pclass;
  undefined1 local_230 [8];
  FScanner sc;
  PClassPlayerPawn *transtype;
  PClassPlayerPawn *basetype;
  int iStack_118;
  bool remove;
  int aliasid;
  int lastlump;
  int base;
  int k;
  int j;
  size_t i;
  DWORD crouchname;
  DWORD intname;
  char key [65];
  int aiStack_a8 [2];
  int sndlumps [17];
  spritedef_t temp;
  FSoundID playersoundrefs [17];
  
  local_bc0 = (FSoundID *)((long)&temp.field_0 + 4);
  do {
    FSoundID::FSoundID(local_bc0);
    local_bc0 = local_bc0 + 1;
  } while (local_bc0 != playersoundrefs + 0xf);
  key[0x38] = '\0';
  uVar6 = TArray<FPlayerClass,_FPlayerClass>::Size(&PlayerClasses);
  _k = (ulong)(uVar6 - 1);
  iStack_118 = 0;
  for (base = 0; base < 0x11; base = base + 1) {
    FSoundID::operator=(playersoundrefs + (long)base + -2,skinsoundnames[base][1]);
  }
  do {
    do {
      iVar7 = FWadCollection::FindLump(&Wads,"S_SKIN",&stack0xfffffffffffffee8,true);
      sVar3 = numskins;
      aliasid = iVar7;
      if (iVar7 == -1) {
        uVar6 = TArray<FPlayerClass,_FPlayerClass>::Size(&PlayerClasses);
        if (uVar6 < sVar3) {
          S_HashSounds();
          S_ShrinkPlayerSoundLists();
        }
        return;
      }
      iVar8 = FWadCollection::GetNumLumps(&Wads);
    } while ((iVar8 + -0x17 <= iVar7) || (aliasid == -1));
    _k = _k + 1;
    for (base = 0; base < 0x11; base = base + 1) {
      aiStack_a8[base] = -1;
    }
    iVar7 = FWadCollection::GetLumpNamespace(&Wads,aliasid);
    skins[_k].namespc = iVar7;
    FScanner::FScanner((FScanner *)local_230,aliasid);
    i._4_4_ = 0;
    i._0_4_ = 0;
    bVar2 = false;
    transtype = (PClassPlayerPawn *)0x0;
    sc.LastGotLine = 0;
    sc.CMode = false;
    sc.StateMode = '\0';
    sc.StateOptions = false;
    sc.Escape = false;
LAB_00745b7b:
    bVar5 = FScanner::GetString((FScanner *)local_230);
    if (!bVar5) goto LAB_007465d3;
    strncpy((char *)&crouchname,(char *)local_230,0x40);
    bVar5 = FScanner::GetString((FScanner *)local_230);
    if ((!bVar5) || (*(char *)local_230 != '=')) {
      Printf(200,"Bad format for skin %d: %s\n",_k & 0xffffffff,&crouchname);
      goto LAB_007465d3;
    }
    FScanner::GetString((FScanner *)local_230);
    iVar7 = strcasecmp((char *)&crouchname,"name");
    if (iVar7 == 0) {
      strncpy(skins[_k].name,(char *)local_230,0x10);
      for (base = 0; (ulong)(long)base < _k; base = base + 1) {
        iVar7 = strcasecmp(skins[_k].name,skins[base].name);
        if (iVar7 == 0) {
          mysnprintf(skins[_k].name,0x11,"skin%d",_k & 0xffffffff);
          Printf(200,"Skin %s duplicated as %s\n",skins + base,skins + _k);
          break;
        }
      }
      goto LAB_00745b7b;
    }
    iVar7 = strcasecmp((char *)&crouchname,"sprite");
    if (iVar7 == 0) {
      for (base = 3; -1 < base; base = base + -1) {
        iVar7 = toupper((int)*(char *)((long)local_230 + (long)base));
        *(char *)((long)local_230 + (long)base) = (char)iVar7;
      }
      i._4_4_ = *(int *)local_230;
      goto LAB_00745b7b;
    }
    iVar7 = strcasecmp((char *)&crouchname,"crouchsprite");
    if (iVar7 == 0) {
      for (base = 3; -1 < base; base = base + -1) {
        iVar7 = toupper((int)*(char *)((long)local_230 + (long)base));
        *(char *)((long)local_230 + (long)base) = (char)iVar7;
      }
      i._0_4_ = *(int *)local_230;
      goto LAB_00745b7b;
    }
    iVar7 = strcasecmp((char *)&crouchname,"face");
    if (iVar7 == 0) {
      for (base = 2; -1 < base; base = base + -1) {
        iVar7 = toupper((int)*(char *)((long)local_230 + (long)base));
        skins[_k].face[base] = (char)iVar7;
      }
      skins[_k].face[3] = '\0';
      goto LAB_00745b7b;
    }
    iVar7 = strcasecmp((char *)&crouchname,"gender");
    if (iVar7 == 0) {
      iVar7 = D_GenderToInt((char *)local_230);
      skins[_k].gender = (BYTE)iVar7;
      goto LAB_00745b7b;
    }
    iVar7 = strcasecmp((char *)&crouchname,"scale");
    if (iVar7 == 0) {
      dVar14 = atof((char *)local_230);
      dVar14 = clamp<double>(dVar14,1.52587890625e-05,256.0);
      skins[_k].Scale.X = dVar14;
      skins[_k].Scale.Y = skins[_k].Scale.X;
      goto LAB_00745b7b;
    }
    iVar7 = strcasecmp((char *)&crouchname,"game");
    if (iVar7 != 0) {
      iVar7 = strcasecmp((char *)&crouchname,"class");
      if (iVar7 == 0) {
        iVar7 = D_PlayerClassToInt((char *)local_230);
        if (iVar7 < 0) {
          bVar2 = true;
          goto LAB_007465d3;
        }
        pFVar10 = TArray<FPlayerClass,_FPlayerClass>::operator[](&PlayerClasses,(long)iVar7);
        sc._248_8_ = pFVar10->Type;
        transtype = (PClassPlayerPawn *)sc._248_8_;
      }
      else if ((char)crouchname == '*') {
        sndref = FWadCollection::CheckNumForName(&Wads,(char *)local_230,skins[_k].namespc);
        if (sndref == -1) {
          sndref = FWadCollection::CheckNumForFullName(&Wads,(char *)local_230,true,0xd);
        }
        if (sndref != -1) {
          iVar7 = strcasecmp((char *)&crouchname,"*pain");
          if (iVar7 == 0) {
            pFVar13 = skins + _k;
            bVar1 = skins[_k].gender;
            iVar7 = FSoundID::operator_cast_to_int((FSoundID *)((long)&temp.field_0 + 4));
            iVar7 = S_AddPlayerSound(pFVar13->name,(uint)bVar1,iVar7,sndref,true);
            for (local_248 = 3; 0 < local_248; local_248 = local_248 + -1) {
              pFVar13 = skins + _k;
              bVar1 = skins[_k].gender;
              iVar8 = FSoundID::operator_cast_to_int(playersoundrefs + (long)local_248 + -2);
              S_AddPlayerSoundExisting(pFVar13->name,(uint)bVar1,iVar8,iVar7,true);
            }
          }
          else {
            iVar7 = S_FindSoundNoHash((char *)&crouchname);
            if (iVar7 != 0) {
              S_AddPlayerSound(skins[_k].name,(uint)skins[_k].gender,iVar7,sndref,true);
            }
          }
        }
      }
      else {
        for (base = 0; base < 0x11; base = base + 1) {
          iVar7 = strcasecmp((char *)&crouchname,skinsoundnames[base][0]);
          if (iVar7 == 0) {
            iVar7 = FWadCollection::CheckNumForName(&Wads,(char *)local_230,skins[_k].namespc);
            aiStack_a8[base] = iVar7;
            if (aiStack_a8[base] == -1) {
              iVar7 = FWadCollection::CheckNumForFullName(&Wads,(char *)local_230,true,0xd);
              aiStack_a8[base] = iVar7;
            }
          }
        }
      }
      goto LAB_00745b7b;
    }
    if (gameinfo.gametype == GAME_Heretic) {
      pPVar9 = PClass::FindActor(NAME_HereticPlayer);
      transtype = dyn_cast<PClassPlayerPawn>((DObject *)pPVar9);
    }
    else if (gameinfo.gametype == GAME_Strife) {
      pPVar9 = PClass::FindActor(NAME_StrifePlayer);
      transtype = dyn_cast<PClassPlayerPawn>((DObject *)pPVar9);
    }
    else {
      pPVar9 = PClass::FindActor(NAME_DoomPlayer);
      transtype = dyn_cast<PClassPlayerPawn>((DObject *)pPVar9);
    }
    sc._248_8_ = transtype;
    iVar7 = strcasecmp((char *)local_230,"heretic");
    if (iVar7 == 0) {
      if ((gameinfo.gametype & GAME_DoomChex) == GAME_Any) {
        if (gameinfo.gametype != GAME_Heretic) {
          bVar2 = true;
        }
      }
      else {
        pPVar9 = PClass::FindActor(NAME_HereticPlayer);
        sc._248_8_ = dyn_cast<PClassPlayerPawn>((DObject *)pPVar9);
        skins[_k].othergame = true;
      }
    }
    else {
      iVar7 = strcasecmp((char *)local_230,"strife");
      if (iVar7 == 0) {
        if (gameinfo.gametype != GAME_Strife) {
          bVar2 = true;
        }
      }
      else if (gameinfo.gametype == GAME_Heretic) {
        pPVar9 = PClass::FindActor(NAME_DoomPlayer);
        sc._248_8_ = dyn_cast<PClassPlayerPawn>((DObject *)pPVar9);
        skins[_k].othergame = true;
      }
      else if ((gameinfo.gametype & GAME_DoomChex) == GAME_Any) {
        bVar2 = true;
      }
    }
    if (!bVar2) goto LAB_00745b7b;
LAB_007465d3:
    if ((!bVar2) && (transtype == (PClassPlayerPawn *)0x0)) {
      if ((gameinfo.gametype & GAME_DoomChex) == GAME_Any) {
        if (gameinfo.gametype == GAME_Heretic) {
          pPVar9 = PClass::FindActor(NAME_HereticPlayer);
          transtype = dyn_cast<PClassPlayerPawn>((DObject *)pPVar9);
          pPVar9 = PClass::FindActor(NAME_DoomPlayer);
          sc._248_8_ = dyn_cast<PClassPlayerPawn>((DObject *)pPVar9);
          skins[_k].othergame = true;
        }
        else {
          bVar2 = true;
        }
      }
      else {
        pPVar9 = PClass::FindActor(NAME_DoomPlayer);
        sc._248_8_ = dyn_cast<PClassPlayerPawn>((DObject *)pPVar9);
        transtype = (PClassPlayerPawn *)sc._248_8_;
      }
    }
    if (!bVar2) {
      skins[_k].range0start = *(BYTE *)(sc._248_8_ + 0x290);
      skins[_k].range0end = *(BYTE *)(sc._248_8_ + 0x291);
      bVar2 = true;
      for (base = 0; iVar7 = base, uVar6 = TArray<FPlayerClass,_FPlayerClass>::Size(&PlayerClasses),
          iVar7 < (int)uVar6; base = base + 1) {
        pFVar10 = TArray<FPlayerClass,_FPlayerClass>::operator[](&PlayerClasses,(long)base);
        unique0x00012000 = pFVar10->Type;
        bVar5 = PClass::IsDescendantOf((PClass *)unique0x00012000,(PClass *)transtype);
        if (bVar5) {
          pAVar11 = GetDefaultByType((PClass *)stack0xfffffffffffffda8);
          iVar7 = pAVar11->SpawnState->sprite;
          pAVar11 = GetDefaultByType((PClass *)transtype);
          if (((iVar7 == pAVar11->SpawnState->sprite) &&
              (stack0xfffffffffffffda8->ColorRangeStart == transtype->ColorRangeStart)) &&
             (stack0xfffffffffffffda8->ColorRangeEnd == transtype->ColorRangeEnd)) {
            pFVar10 = TArray<FPlayerClass,_FPlayerClass>::operator[](&PlayerClasses,(long)base);
            uVar4 = _k;
            name[1] = (undefined1)k;
            name[2] = k._1_1_;
            name[3] = k._2_1_;
            name[4] = k._3_1_;
            _k = uVar4;
            TArray<int,_int>::Push(&pFVar10->Skins,(int *)(name + 1));
            bVar2 = false;
          }
        }
      }
    }
    if (!bVar2) {
      if (skins[_k].name[0] == '\0') {
        mysnprintf(skins[_k].name,0x11,"skin%d",_k & 0xffffffff);
      }
      if (i._4_4_ == 0) {
        FWadCollection::GetLumpName(&Wads,(char *)((long)&spr + 3),aliasid + 1);
        i._4_4_ = stack0xfffffffffffffd9b;
      }
      iVar7 = FWadCollection::GetLumpNamespace(&Wads,aliasid);
      for (local_270 = 0; local_270 < 2; local_270 = local_270 + 1) {
        local_d00 = (spriteframewithrotate *)(lname + 5);
        do {
          spriteframewithrotate::spriteframewithrotate(local_d00);
          local_d00 = local_d00 + 1;
        } while (local_d00 != (spriteframewithrotate *)&sprtemp[0x1c].super_spriteframe_t.Flip);
        memset(lname + 5,0xff,0x910);
        for (lastlump = 0; lastlump < 0x1d; lastlump = lastlump + 1) {
          *(undefined2 *)&sprtemp[lastlump].super_spriteframe_t.Texture[0xe].texnum = 0;
          pcVar12 = lname + (long)lastlump * 0x50 + 5;
          pcVar12[0] = '\0';
          pcVar12[1] = '\0';
          pcVar12[2] = '\0';
          pcVar12[3] = '\0';
          pcVar12[4] = '\0';
          pcVar12[5] = '\0';
          pcVar12[6] = '\0';
          pcVar12[7] = '\0';
        }
        lname[1] = -1;
        lname[2] = -1;
        lname[3] = -1;
        lname[4] = -1;
        iVar8 = aliasid;
        if (local_270 == 1) {
          if (((int)i == 0) || ((int)i == i._4_4_)) {
            skins[_k].crouchsprite = -1;
            break;
          }
          i._4_4_ = (int)i;
        }
        while( true ) {
          lastlump = iVar8 + 1;
          iVar8 = FWadCollection::GetLumpNamespace(&Wads,lastlump);
          if (iVar8 != iVar7) break;
          FWadCollection::GetLumpName(&Wads,(char *)((long)&picnum.texnum + 3),lastlump);
          iVar8 = lastlump;
          if (stack0xfffffffffffff46b == i._4_4_) {
            lump_00 = FTextureManager::CreateTexture(&TexMan,lastlump,6);
            bVar5 = R_InstallSpriteLump(lump_00,(int)lnameint._3_1_ - 0x41,local_b90,false,
                                        (spriteframewithrotate *)(lname + 5),(int *)(lname + 1));
            iVar8 = lastlump;
            if ((local_b8f != '\0') && (bVar5)) {
              R_InstallSpriteLump(lump_00,(int)local_b8f - 0x41,local_b8e,true,
                                  (spriteframewithrotate *)(lname + 5),(int *)(lname + 1));
              iVar8 = lastlump;
            }
          }
        }
        if ((local_270 == 0) && ((int)lname._1_4_ < 1)) {
          Printf(200,"Skin %s (#%d) has no frames. Removing.\n",skins + _k,_k & 0xffffffff);
          bVar2 = true;
          break;
        }
        FWadCollection::GetLumpName(&Wads,(char *)(sndlumps + 0xf),aliasid + 1);
        sndlumps[0x10]._0_1_ = 0;
        uVar6 = TArray<spritedef_t,_spritedef_t>::Push(&sprites,(spritedef_t *)(sndlumps + 0xf));
        if (local_270 == 0) {
          skins[_k].sprite = uVar6;
        }
        else {
          skins[_k].crouchsprite = uVar6;
        }
        R_InstallSprite(uVar6,(spriteframewithrotate *)(lname + 5),(int *)(lname + 1));
      }
    }
    if (bVar2) {
      if (_k < numskins - 1) {
        memmove(skins + _k,skins + _k + 1,((numskins - _k) + -1) * 0x40);
      }
      _k = _k - 1;
    }
    else {
      basetype._4_4_ = 0;
      for (base = 0; base < 0x11; base = base + 1) {
        if (aiStack_a8[base] != -1) {
          if ((base == 0) || (aiStack_a8[base] != aiStack_a8[base + -1])) {
            pFVar13 = skins + _k;
            bVar1 = skins[_k].gender;
            iVar7 = FSoundID::operator_cast_to_int(playersoundrefs + (long)base + -2);
            basetype._4_4_ = S_AddPlayerSound(pFVar13->name,(uint)bVar1,iVar7,aiStack_a8[base],true)
            ;
          }
          else {
            pFVar13 = skins + _k;
            bVar1 = skins[_k].gender;
            iVar7 = FSoundID::operator_cast_to_int(playersoundrefs + (long)base + -2);
            S_AddPlayerSoundExisting(pFVar13->name,(uint)bVar1,iVar7,basetype._4_4_,true);
          }
        }
      }
      if ((skins[_k].face[1] == '\0') || (skins[_k].face[2] == '\0')) {
        skins[_k].face[0] = '\0';
      }
    }
    FScanner::~FScanner((FScanner *)local_230);
  } while( true );
}

Assistant:

void R_InitSkins (void)
{
	FSoundID playersoundrefs[NUMSKINSOUNDS];
	spritedef_t temp;
	int sndlumps[NUMSKINSOUNDS];
	char key[65];
	DWORD intname, crouchname;
	size_t i;
	int j, k, base;
	int lastlump;
	int aliasid;
	bool remove;
	PClassPlayerPawn *basetype, *transtype;

	key[sizeof(key)-1] = 0;
	i = PlayerClasses.Size () - 1;
	lastlump = 0;

	for (j = 0; j < NUMSKINSOUNDS; ++j)
	{
		playersoundrefs[j] = skinsoundnames[j][1];
	}

	while ((base = Wads.FindLump ("S_SKIN", &lastlump, true)) != -1)
	{
		// The player sprite has 23 frames. This means that the S_SKIN
		// marker needs a minimum of 23 lumps after it.
		if (base >= Wads.GetNumLumps() - 23 || base == -1)
			continue;

		i++;
		for (j = 0; j < NUMSKINSOUNDS; j++)
			sndlumps[j] = -1;
		skins[i].namespc = Wads.GetLumpNamespace (base);

		FScanner sc(base);
		intname = 0;
		crouchname = 0;

		remove = false;
		basetype = NULL;
		transtype = NULL;

		// Data is stored as "key = data".
		while (sc.GetString ())
		{
			strncpy (key, sc.String, sizeof(key)-1);
			if (!sc.GetString() || sc.String[0] != '=')
			{
				Printf (PRINT_BOLD, "Bad format for skin %d: %s\n", (int)i, key);
				break;
			}
			sc.GetString ();
			if (0 == stricmp (key, "name"))
			{
				strncpy (skins[i].name, sc.String, 16);
				for (j = 0; (size_t)j < i; j++)
				{
					if (stricmp (skins[i].name, skins[j].name) == 0)
					{
						mysnprintf (skins[i].name, countof(skins[i].name), "skin%d", (int)i);
						Printf (PRINT_BOLD, "Skin %s duplicated as %s\n",
							skins[j].name, skins[i].name);
						break;
					}
				}
			}
			else if (0 == stricmp (key, "sprite"))
			{
				for (j = 3; j >= 0; j--)
					sc.String[j] = toupper (sc.String[j]);
				intname = *((DWORD *)sc.String);
			}
			else if (0 == stricmp (key, "crouchsprite"))
			{
				for (j = 3; j >= 0; j--)
					sc.String[j] = toupper (sc.String[j]);
				crouchname = *((DWORD *)sc.String);
			}
			else if (0 == stricmp (key, "face"))
			{
				for (j = 2; j >= 0; j--)
					skins[i].face[j] = toupper (sc.String[j]);
				skins[i].face[3] = '\0';
			}
			else if (0 == stricmp (key, "gender"))
			{
				skins[i].gender = D_GenderToInt (sc.String);
			}
			else if (0 == stricmp (key, "scale"))
			{
				skins[i].Scale.X = clamp(atof (sc.String), 1./65536, 256.);
				skins[i].Scale.Y = skins[i].Scale.X;
			}
			else if (0 == stricmp (key, "game"))
			{
				if (gameinfo.gametype == GAME_Heretic)
					basetype = dyn_cast<PClassPlayerPawn>(PClass::FindActor(NAME_HereticPlayer));
				else if (gameinfo.gametype == GAME_Strife)
					basetype = dyn_cast<PClassPlayerPawn>(PClass::FindActor(NAME_StrifePlayer));
				else
					basetype = dyn_cast<PClassPlayerPawn>(PClass::FindActor(NAME_DoomPlayer));

				transtype = basetype;

				if (stricmp (sc.String, "heretic") == 0)
				{
					if (gameinfo.gametype & GAME_DoomChex)
					{
						transtype = dyn_cast<PClassPlayerPawn>(PClass::FindActor(NAME_HereticPlayer));
						skins[i].othergame = true;
					}
					else if (gameinfo.gametype != GAME_Heretic)
					{
						remove = true;
					}
				}
				else if (stricmp (sc.String, "strife") == 0)
				{
					if (gameinfo.gametype != GAME_Strife)
					{
						remove = true;
					}
				}
				else
				{
					if (gameinfo.gametype == GAME_Heretic)
					{
						transtype = dyn_cast<PClassPlayerPawn>(PClass::FindActor(NAME_DoomPlayer));
						skins[i].othergame = true;
					}
					else if (!(gameinfo.gametype & GAME_DoomChex))
					{
						remove = true;
					}
				}

				if (remove)
					break;
			}
			else if (0 == stricmp (key, "class"))
			{ // [GRB] Define the skin for a specific player class
				int pclass = D_PlayerClassToInt (sc.String);

				if (pclass < 0)
				{
					remove = true;
					break;
				}

				basetype = transtype = PlayerClasses[pclass].Type;
			}
			else if (key[0] == '*')
			{ // Player sound replacment (ZDoom extension)
				int lump = Wads.CheckNumForName (sc.String, skins[i].namespc);
				if (lump == -1)
				{
					lump = Wads.CheckNumForFullName (sc.String, true, ns_sounds);
				}
				if (lump != -1)
				{
					if (stricmp (key, "*pain") == 0)
					{ // Replace all pain sounds in one go
						aliasid = S_AddPlayerSound (skins[i].name, skins[i].gender,
							playersoundrefs[0], lump, true);
						for (int l = 3; l > 0; --l)
						{
							S_AddPlayerSoundExisting (skins[i].name, skins[i].gender,
								playersoundrefs[l], aliasid, true);
						}
					}
					else
					{
						int sndref = S_FindSoundNoHash (key);
						if (sndref != 0)
						{
							S_AddPlayerSound (skins[i].name, skins[i].gender, sndref, lump, true);
						}
					}
				}
			}
			else
			{
				for (j = 0; j < NUMSKINSOUNDS; j++)
				{
					if (stricmp (key, skinsoundnames[j][0]) == 0)
					{
						sndlumps[j] = Wads.CheckNumForName (sc.String, skins[i].namespc);
						if (sndlumps[j] == -1)
						{ // Replacement not found, try finding it in the global namespace
							sndlumps[j] = Wads.CheckNumForFullName (sc.String, true, ns_sounds);
						}
					}
				}
				//if (j == 8)
				//	Printf ("Funny info for skin %i: %s = %s\n", i, key, sc.String);
			}
		}

		// [GRB] Assume Doom skin by default
		if (!remove && basetype == NULL)
		{
			if (gameinfo.gametype & GAME_DoomChex)
			{
				basetype = transtype = dyn_cast<PClassPlayerPawn>(PClass::FindActor(NAME_DoomPlayer));
			}
			else if (gameinfo.gametype == GAME_Heretic)
			{
				basetype = dyn_cast<PClassPlayerPawn>(PClass::FindActor(NAME_HereticPlayer));
				transtype = dyn_cast<PClassPlayerPawn>(PClass::FindActor(NAME_DoomPlayer));
				skins[i].othergame = true;
			}
			else
			{
				remove = true;
			}
		}

		if (!remove)
		{
			skins[i].range0start = transtype->ColorRangeStart;
			skins[i].range0end = transtype->ColorRangeEnd;

			remove = true;
			for (j = 0; j < (int)PlayerClasses.Size (); j++)
			{
				PClassPlayerPawn *type = PlayerClasses[j].Type;

				if (type->IsDescendantOf (basetype) &&
					GetDefaultByType(type)->SpawnState->sprite == GetDefaultByType(basetype)->SpawnState->sprite &&
					type->ColorRangeStart == basetype->ColorRangeStart &&
					type->ColorRangeEnd == basetype->ColorRangeEnd)
				{
					PlayerClasses[j].Skins.Push ((int)i);
					remove = false;
				}
			}
		}

		if (!remove)
		{
			if (skins[i].name[0] == 0)
				mysnprintf (skins[i].name, countof(skins[i].name), "skin%d", (int)i);

			// Now collect the sprite frames for this skin. If the sprite name was not
			// specified, use whatever immediately follows the specifier lump.
			if (intname == 0)
			{
				char name[9];
				Wads.GetLumpName (name, base+1);
				memcpy(&intname, name, 4);
			}

			int basens = Wads.GetLumpNamespace(base);

			for(int spr = 0; spr<2; spr++)
			{
				spriteframewithrotate sprtemp[MAX_SPRITE_FRAMES];
				memset (sprtemp, 0xFFFF, sizeof(sprtemp));
				for (k = 0; k < MAX_SPRITE_FRAMES; ++k)
				{
					sprtemp[k].Flip = 0;
					sprtemp[k].Voxel = NULL;
				}
				int maxframe = -1;

				if (spr == 1)
				{
					if (crouchname !=0 && crouchname != intname)
					{
						intname = crouchname;
					}
					else
					{
						skins[i].crouchsprite = -1;
						break;
					}
				}

				for (k = base + 1; Wads.GetLumpNamespace(k) == basens; k++)
				{
					char lname[9];
					DWORD lnameint;
					Wads.GetLumpName (lname, k);
					memcpy(&lnameint, lname, 4);
					if (lnameint == intname)
					{
						FTextureID picnum = TexMan.CreateTexture(k, FTexture::TEX_SkinSprite);
						bool res = R_InstallSpriteLump (picnum, lname[4] - 'A', lname[5], false, sprtemp, maxframe);

						if (lname[6] && res)
							R_InstallSpriteLump (picnum, lname[6] - 'A', lname[7], true, sprtemp, maxframe);
					}
				}

				if (spr == 0 && maxframe <= 0)
				{
					Printf (PRINT_BOLD, "Skin %s (#%d) has no frames. Removing.\n", skins[i].name, (int)i);
					remove = true;
					break;
				}

				Wads.GetLumpName (temp.name, base+1);
				temp.name[4] = 0;
				int sprno = (int)sprites.Push (temp);
				if (spr==0)	skins[i].sprite = sprno;
				else skins[i].crouchsprite = sprno;
				R_InstallSprite (sprno, sprtemp, maxframe);
			}
		}

		if (remove)
		{
			if (i < numskins-1)
				memmove (&skins[i], &skins[i+1], sizeof(skins[0])*(numskins-i-1));
			i--;
			continue;
		}

		// Register any sounds this skin provides
		aliasid = 0;
		for (j = 0; j < NUMSKINSOUNDS; j++)
		{
			if (sndlumps[j] != -1)
			{
				if (j == 0 || sndlumps[j] != sndlumps[j-1])
				{
					aliasid = S_AddPlayerSound (skins[i].name, skins[i].gender,
						playersoundrefs[j], sndlumps[j], true);
				}
				else
				{
					S_AddPlayerSoundExisting (skins[i].name, skins[i].gender,
						playersoundrefs[j], aliasid, true);
				}
			}
		}

		// Make sure face prefix is a full 3 chars
		if (skins[i].face[1] == 0 || skins[i].face[2] == 0)
		{
			skins[i].face[0] = 0;
		}
	}

	if (numskins > PlayerClasses.Size ())
	{ // The sound table may have changed, so rehash it.
		S_HashSounds ();
		S_ShrinkPlayerSoundLists ();
	}
}